

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O0

void CallExpression_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  int argc_00;
  JsValue *res_00;
  int local_58;
  int i;
  int argc;
  JsValue **argv;
  JsValue *args;
  JsValue r1;
  JsAstCallExpressionNode *n;
  JsValue *res_local;
  JsContext *context_local;
  JsAstNode *na_local;
  
  r1.u.reference.name = (char *)na;
  (*JsNodeClassEval[**(uint **)(na + 1)])(*(JsAstNode **)(na + 1),context,(JsValue *)&args);
  argc_00 = *(int *)(*(long *)(r1.u.reference.name + 0x18) + 0x10);
  if (argc_00 < 1) {
    _i = (JsValue **)0x0;
  }
  else {
    res_00 = (JsValue *)JsMalloc(argc_00 * 0x18);
    _i = (JsValue **)JsMalloc(argc_00 << 3);
    Arguments_eval(*(JsAstNode **)(r1.u.reference.name + 0x18),context,res_00);
    for (local_58 = 0; local_58 < argc_00; local_58 = local_58 + 1) {
      _i[local_58] = res_00 + local_58;
    }
  }
  CallExpression_eval_common(context,na->location,(JsValue *)&args,argc_00,_i,res);
  return;
}

Assistant:

static void
CallExpression_eval(na, context, res)
	struct JsAstNode *na; /* (struct CallExpression_node) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstCallExpressionNode *n = CAST_NODE(na, JsAstCallExpressionNode);
	struct JsValue r1, *args, **argv;
	int argc, i;

	EVAL(n->exp, context, &r1);
	argc = n->args->argc;
	if (argc > 0) {
		args = (struct JsValue*)JsMalloc( sizeof(struct JsValue) * argc);
		argv = (struct JsValue**)JsMalloc( sizeof(struct JsValue*) * argc);
		Arguments_eval((struct JsAstNode *)n->args, context, args);
		for (i = 0; i < argc; i++)
			argv[i] = &args[i];
	}else 
		argv = NULL;
	CallExpression_eval_common(context, na->location, &r1, argc, argv, res);
}